

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_avx2.c
# Opt level: O0

void sobel_filter(uint8_t *src,int src_stride,int16_t *dx,int16_t *dy)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 *puVar3;
  long in_RCX;
  long in_RDX;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  __m256i dy_row;
  __m256i dx_row;
  __m256i row_0_p1_hdiff;
  __m256i row_p1_p2_hdiff;
  __m256i row_p1_p2_hsmooth;
  __m256i row_p1_p2_c;
  __m256i row_p1_p2_b;
  __m256i row_p1_p2_a;
  __m256i row_p1_p2;
  int i;
  __m256i row_m1_0_hdiff;
  __m256i row_m1_0_hsmooth;
  __m256i row_m1_0_c;
  __m256i row_m1_0_b;
  __m256i row_m1_0_a;
  __m256i row_m1_0;
  __m256i zero;
  undefined8 local_780;
  undefined8 uStackY_778;
  undefined8 uStackY_770;
  undefined8 uStackY_768;
  void *lo;
  undefined8 uStack_750;
  undefined1 local_760 [32];
  undefined8 uStack_748;
  int local_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  void *hi;
  
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  yy_loadu2_128(hi,lo);
  auVar9._8_8_ = uVar5;
  auVar9._0_8_ = uVar4;
  auVar9._16_8_ = uVar6;
  auVar9._24_8_ = uVar7;
  auVar1 = vpunpcklbw_avx2(auVar9,ZEXT1632(ZEXT816(0)));
  auVar8._8_8_ = uVar5;
  auVar8._0_8_ = uVar4;
  auVar8._16_8_ = uVar6;
  auVar8._24_8_ = uVar7;
  auVar8 = vpsrldq_avx2(auVar8,1);
  auVar9 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
  auVar2._8_8_ = uVar5;
  auVar2._0_8_ = uVar4;
  auVar2._16_8_ = uVar6;
  auVar2._24_8_ = uVar7;
  auVar8 = vpsrldq_avx2(auVar2,2);
  auVar2 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
  auVar8 = vpaddw_avx2(auVar1,auVar2);
  auVar9 = vpsllw_avx2(auVar9,ZEXT416(1));
  local_620 = vpaddw_avx2(auVar8,auVar9);
  local_640 = vpsubw_avx2(auVar1,auVar2);
  for (local_644 = 0; local_644 < 8; local_644 = local_644 + 2) {
    auVar8 = local_640;
    yy_loadu2_128(hi,lo);
    auVar1 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
    auVar9 = vpsrldq_avx2(auVar8,1);
    auVar9 = vpunpcklbw_avx2(auVar9,ZEXT1632(ZEXT816(0)));
    auVar8 = vpsrldq_avx2(auVar8,2);
    auVar2 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
    auVar8 = vpaddw_avx2(auVar1,auVar2);
    auVar9 = vpsllw_avx2(auVar9,ZEXT416(1));
    auVar8 = vpaddw_avx2(auVar8,auVar9);
    auVar2 = vpsubw_avx2(auVar1,auVar2);
    auVar1 = vperm2i128_avx2(local_640,auVar2,0x21);
    auVar9 = vpaddw_avx2(local_640,auVar2);
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    local_760 = vpaddw_avx2(auVar9,auVar1);
    auVar9 = vpsubw_avx2(local_620,auVar8);
    puVar3 = (undefined8 *)(in_RDX + (long)(local_644 << 3) * 2);
    *puVar3 = lo;
    puVar3[1] = hi;
    puVar3[2] = uStack_750;
    puVar3[3] = uStack_748;
    puVar3 = (undefined8 *)(in_RCX + (long)(local_644 << 3) * 2);
    local_780 = auVar9._0_8_;
    uStackY_778 = auVar9._8_8_;
    uStackY_770 = auVar9._16_8_;
    uStackY_768 = auVar9._24_8_;
    *puVar3 = local_780;
    puVar3[1] = uStackY_778;
    puVar3[2] = uStackY_770;
    puVar3[3] = uStackY_768;
    local_640 = auVar2;
    local_620 = auVar8;
  }
  return;
}

Assistant:

static inline void sobel_filter(const uint8_t *src, int src_stride, int16_t *dx,
                                int16_t *dy) {
  const __m256i zero = _mm256_setzero_si256();

  // Loop setup: Load the first two rows (of 10 input rows) and apply
  // the horizontal parts of the two filters
  __m256i row_m1_0 =
      yy_loadu2_128((__m128i *)(src - 1), (__m128i *)(src - src_stride - 1));
  __m256i row_m1_0_a = _mm256_unpacklo_epi8(row_m1_0, zero);
  __m256i row_m1_0_b =
      _mm256_unpacklo_epi8(_mm256_srli_si256(row_m1_0, 1), zero);
  __m256i row_m1_0_c =
      _mm256_unpacklo_epi8(_mm256_srli_si256(row_m1_0, 2), zero);

  __m256i row_m1_0_hsmooth =
      _mm256_add_epi16(_mm256_add_epi16(row_m1_0_a, row_m1_0_c),
                       _mm256_slli_epi16(row_m1_0_b, 1));
  __m256i row_m1_0_hdiff = _mm256_sub_epi16(row_m1_0_a, row_m1_0_c);

  // Main loop: For each pair of output rows (i, i+1):
  // * Load rows (i+1, i+2) and apply both horizontal filters
  // * Apply vertical filters and store results
  // * Shift rows for next iteration
  for (int i = 0; i < DISFLOW_PATCH_SIZE; i += 2) {
    // Load rows (i+1, i+2) and apply both horizontal filters
    const __m256i row_p1_p2 =
        yy_loadu2_128((__m128i *)(src + (i + 2) * src_stride - 1),
                      (__m128i *)(src + (i + 1) * src_stride - 1));
    const __m256i row_p1_p2_a = _mm256_unpacklo_epi8(row_p1_p2, zero);
    const __m256i row_p1_p2_b =
        _mm256_unpacklo_epi8(_mm256_srli_si256(row_p1_p2, 1), zero);
    const __m256i row_p1_p2_c =
        _mm256_unpacklo_epi8(_mm256_srli_si256(row_p1_p2, 2), zero);

    const __m256i row_p1_p2_hsmooth =
        _mm256_add_epi16(_mm256_add_epi16(row_p1_p2_a, row_p1_p2_c),
                         _mm256_slli_epi16(row_p1_p2_b, 1));
    const __m256i row_p1_p2_hdiff = _mm256_sub_epi16(row_p1_p2_a, row_p1_p2_c);

    // Apply vertical filters and store results
    // dx = vertical smooth(horizontal diff(input))
    // dy = vertical diff(horizontal smooth(input))
    const __m256i row_0_p1_hdiff =
        _mm256_permute2x128_si256(row_m1_0_hdiff, row_p1_p2_hdiff, 0x21);
    const __m256i dx_row =
        _mm256_add_epi16(_mm256_add_epi16(row_m1_0_hdiff, row_p1_p2_hdiff),
                         _mm256_slli_epi16(row_0_p1_hdiff, 1));
    const __m256i dy_row =
        _mm256_sub_epi16(row_m1_0_hsmooth, row_p1_p2_hsmooth);

    _mm256_storeu_si256((__m256i *)(dx + i * DISFLOW_PATCH_SIZE), dx_row);
    _mm256_storeu_si256((__m256i *)(dy + i * DISFLOW_PATCH_SIZE), dy_row);

    // Shift rows for next iteration
    // This allows a lot of work to be reused, reducing the number of
    // horizontal filtering operations from 2*3*8 = 48 to 2*10 = 20
    row_m1_0_hsmooth = row_p1_p2_hsmooth;
    row_m1_0_hdiff = row_p1_p2_hdiff;
  }
}